

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O2

void __thiscall
ExprVisitorTest_VisitLogicalConstant_Test::TestBody(ExprVisitorTest_VisitLogicalConstant_Test *this)

{
  bool bVar1;
  LogicalConstant value;
  MockSpec<TestResult_(mp::LogicalConstant)> *this_00;
  MockSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)> *this_01;
  char *pcVar2;
  StrictMock<MockVisitor> *this_02;
  BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes> local_118;
  AssertionResult gtest_ar;
  StrictMock<MockUnhandledVisitor> visitor;
  
  value = mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                    (&(this->super_ExprVisitorTest).factory_,true);
  this_02 = &(this->super_ExprVisitorTest).visitor_;
  testing::Matcher<mp::LogicalConstant>::Matcher((Matcher<mp::LogicalConstant> *)&visitor,value);
  this_00 = MockVisitor::gmock_VisitLogicalConstant
                      (&this_02->super_MockVisitor,(Matcher<mp::LogicalConstant> *)&visitor);
  pcVar2 = "visitor_";
  testing::internal::MockSpec<TestResult_(mp::LogicalConstant)>::InternalExpectedAt
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
             ,0x195,"visitor_","VisitLogicalConstant(e)");
  testing::internal::MatcherBase<mp::LogicalConstant>::~MatcherBase
            ((MatcherBase<mp::LogicalConstant> *)&visitor);
  mp::BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
            ((BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes> *)this_02,
             (Expr)value.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.
                   impl_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    local_118._vptr_BasicExprVisitor =
         (_func_int **)
         mp::expr::str(*(Kind *)value.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
                                super_ExprBase.impl_);
    fmt::format<char_const*>
              ((string *)&visitor,(fmt *)"unsupported: {}",(CStringRef)&local_118,(char **)pcVar2);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      testing::StrictMock<NullVisitor>::StrictMock((StrictMock<NullVisitor> *)&local_118);
      mp::BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
                (&local_118,
                 (Expr)value.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.
                       impl_);
      testing::StrictMock<NullVisitor>::~StrictMock((StrictMock<NullVisitor> *)&local_118);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [127])
               "Expected: StrictMock<NullVisitor>().Visit(base) throws an exception of type mp::UnsupportedError.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&visitor);
  }
  testing::Message::Message((Message *)&visitor);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_118,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
             ,0x198,pcVar2);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_118,(Message *)&visitor);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&visitor);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::StrictMock<MockUnhandledVisitor>::StrictMock(&visitor);
  testing::Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::Matcher
            ((Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)&gtest_ar,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
             value.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_);
  this_01 = MockUnhandledVisitor::gmock_VisitLogical
                      (&visitor.super_MockUnhandledVisitor,
                       (Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)&gtest_ar)
  ;
  testing::internal::MockSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)>::
  InternalExpectedAt(this_01,
                     "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
                     ,0x198,"visitor","VisitLogical(base)");
  testing::internal::MatcherBase<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::
  ~MatcherBase((MatcherBase<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)&gtest_ar);
  mp::BasicExprVisitor<MockUnhandledVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
            ((BasicExprVisitor<MockUnhandledVisitor,_TestResult,_mp::internal::ExprTypes> *)&visitor
             ,(Expr)value.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.
                    impl_);
  testing::StrictMock<MockUnhandledVisitor>::~StrictMock(&visitor);
  return;
}

Assistant:

TEST_F(ExprVisitorTest, VisitLogicalConstant) {
  auto e = factory_.MakeLogicalConstant(true);
  EXPECT_CALL(visitor_, VisitLogicalConstant(e));
  mp::LogicalExpr base = e;
  visitor_.Visit(base);
  TEST_UNHANDLED_LOGICAL(base);
}